

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

rtosc_arg_val_t * rtosc_itr_next(rtosc_arg_itr_t *itr)

{
  uint uVar1;
  char *pcVar2;
  long *in_RSI;
  rtosc_arg_val_t *in_RDI;
  rtosc_arg_t rVar3;
  int size;
  char type;
  char in_stack_ffffffffffffffcf;
  rtosc_arg_val_t *prVar4;
  uint8_t *in_stack_ffffffffffffffe8;
  uint8_t *local_10;
  
  *(undefined8 *)in_RDI = 0;
  (in_RDI->val).d = 0.0;
  (in_RDI->val).b.data = (uint8_t *)0x0;
  in_RDI->type = *(char *)*in_RSI;
  prVar4 = in_RDI;
  if (in_RDI->type != '\0') {
    rVar3 = extract_arg((uint8_t *)in_RDI,in_stack_ffffffffffffffcf);
    in_stack_ffffffffffffffe8 = (uint8_t *)rVar3.s;
    (prVar4->val).s = (char *)in_stack_ffffffffffffffe8;
    local_10 = rVar3.b.data;
    (prVar4->val).b.data = local_10;
  }
  pcVar2 = advance_past_dummy_args((char *)(*in_RSI + 1));
  *in_RSI = (long)pcVar2;
  uVar1 = arg_size(in_stack_ffffffffffffffe8,prVar4->type);
  in_RSI[1] = in_RSI[1] + (long)(int)uVar1;
  return in_RDI;
}

Assistant:

rtosc_arg_val_t rtosc_itr_next(rtosc_arg_itr_t *itr)
{
    //current position provides the value
    rtosc_arg_val_t result = {0,{0}};
    result.type = *itr->type_pos;
    if(result.type)
        result.val = extract_arg(itr->value_pos, result.type);

    //advance
    itr->type_pos = advance_past_dummy_args(itr->type_pos+1);
    char type = result.type;
    int size  = arg_size(itr->value_pos, type);
    itr->value_pos += size;


    return result;
}